

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFilteringTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::TextureCubeFilteringCase::iterate(TextureCubeFilteringCase *this)

{
  code *pcVar1;
  RenderContext *context;
  TestContext *pTVar2;
  int iVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  qpTestResult qVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *str;
  TestLog *pTVar8;
  reference pvVar9;
  TextureCube *pTVar10;
  TextureFormat *format;
  NotSupportedError *this_00;
  MessageBuilder *pMVar11;
  reference pvVar12;
  undefined4 extraout_var_01;
  PixelFormat *pPVar13;
  size_type sVar14;
  bool local_b35;
  MessageBuilder local_a58;
  TextureCubeView local_8d8;
  ConstPixelBufferAccess local_8a0;
  undefined1 local_871;
  undefined1 local_870 [7];
  bool isOk;
  Vector<int,_3> local_6ec;
  TextureCubeView local_6e0;
  ConstPixelBufferAccess local_6a8;
  undefined1 local_67d;
  float local_67c;
  undefined1 auStack_678 [3];
  bool isHighQuality;
  int iStack_674;
  int local_670;
  Vector<int,_3> local_66c;
  Vector<float,_4> local_660;
  tcu local_650 [8];
  float afStack_648 [2];
  undefined1 local_640 [8];
  LookupPrecision lookupPrecision;
  LodPrecision lodPrecision;
  Vector<int,_4> local_5f8;
  Vector<int,_4> local_5e8;
  undefined1 local_5d8 [8];
  IVec4 colorBits;
  PixelFormat pixelFormat;
  undefined1 local_5a8 [7];
  bool isNearestOnly;
  char *local_580;
  MessageBuilder local_578;
  undefined1 local_3f8 [8];
  vector<float,_std::allocator<float>_> texCoord;
  Surface result;
  CubeFace face;
  int faceNdx;
  TextureFormat local_240;
  Sampler local_238;
  undefined1 local_1fc [8];
  ReferenceParams sampleParams;
  TextureFormatInfo fmtInfo;
  TextureFormat *texFmt;
  FilterCase *curCase;
  allocator<char> local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  ScopedLogSection local_38;
  ScopedLogSection iterSection;
  int local_28;
  RandomViewport viewport;
  int viewportSize;
  Functions *gl;
  TextureCubeFilteringCase *this_local;
  long lVar7;
  
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  str = tcu::TestNode::getName((TestNode *)this);
  dVar4 = deStringHash(str);
  dVar5 = ::deInt32Hash(this->m_caseNdx);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)((long)&iterSection.m_log + 4),
             (RenderTarget *)CONCAT44(extraout_var_00,iVar3),0x1c,0x1c,dVar4 ^ dVar5);
  pTVar8 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"Test",&local_79);
  de::toString<int>(&local_b0,&this->m_caseNdx);
  std::operator+(&local_58,&local_78,&local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"Test ",&local_f1);
  de::toString<int>((string *)&curCase,&this->m_caseNdx);
  std::operator+(&local_d0,&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&curCase);
  tcu::ScopedLogSection::ScopedLogSection(&local_38,pTVar8,&local_58,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&curCase);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  pvVar9 = std::
           vector<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase>_>
           ::operator[](&this->m_cases,(long)this->m_caseNdx);
  pTVar10 = glu::TextureCube::getRefTexture(pvVar9->texture);
  format = tcu::TextureCube::getFormat(pTVar10);
  tcu::getTextureFormatInfo((TextureFormatInfo *)&sampleParams.baseLevel,format);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_1fc,TEXTURETYPE_CUBE);
  if ((0x1b < viewport.x) && (0x1b < viewport.y)) {
    pcVar1 = *(code **)(lVar7 + 0xb8);
    dVar4 = glu::TextureCube::getGLTexture(pvVar9->texture);
    (*pcVar1)(0x8513,dVar4);
    (**(code **)(lVar7 + 0x1360))(0x8513,0x2801,this->m_minFilter);
    (**(code **)(lVar7 + 0x1360))(0x8513,0x2800,this->m_magFilter);
    (**(code **)(lVar7 + 0x1360))(0x8513,0x2802,this->m_wrapS);
    (**(code **)(lVar7 + 0x1360))(0x8513,0x2803,this->m_wrapT);
    (**(code **)(lVar7 + 0x1a00))(iterSection.m_log._4_4_,local_28,viewport.x,viewport.y);
    glu::mapGLSampler(&local_238,0x812f,0x812f,this->m_minFilter,this->m_magFilter);
    tcu::Sampler::operator=
              ((Sampler *)(sampleParams.super_RenderParams.colorBias.m_data + 2),&local_238);
    sampleParams.sampler.borderColor.v.uData[2]._0_1_ = 1;
    local_240 = *format;
    local_1fc._4_4_ = glu::TextureTestUtil::getSamplerType(local_240);
    sampleParams.sampler.seamlessCubeMap = false;
    sampleParams.sampler._53_3_ = 0;
    pTVar8 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&face,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&face,(char (*) [14])"Coordinates: ");
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&pvVar9->bottomLeft);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [5])" -> ");
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&pvVar9->topRight);
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&face);
    for (result.m_pixels.m_cap._4_4_ = CUBEFACE_NEGATIVE_X; (int)result.m_pixels.m_cap._4_4_ < 6;
        result.m_pixels.m_cap._4_4_ = result.m_pixels.m_cap._4_4_ + CUBEFACE_POSITIVE_X) {
      tcu::Surface::Surface
                ((Surface *)
                 &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,viewport.x,viewport.y);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_3f8);
      glu::TextureTestUtil::computeQuadTexCoordCube
                ((vector<float,_std::allocator<float>_> *)local_3f8,result.m_pixels.m_cap._4_4_,
                 &pvVar9->bottomLeft,&pvVar9->topRight);
      pTVar8 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_578,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar11 = tcu::MessageBuilder::operator<<(&local_578,(char (*) [6])"Face ");
      local_580 = getFaceDesc(result.m_pixels.m_cap._4_4_);
      pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_580);
      tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_578);
      pvVar12 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_3f8,0);
      deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
                (&this->m_renderer,0,pvVar12,(RenderParams *)local_1fc);
      dVar4 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar4,"Draw",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureFilteringTests.cpp"
                      ,0x25e);
      iVar3 = iterSection.m_log._4_4_;
      context = this->m_renderCtx;
      tcu::Surface::getAccess
                ((PixelBufferAccess *)local_5a8,
                 (Surface *)
                 &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      glu::readPixels(context,iVar3,local_28,(PixelBufferAccess *)local_5a8);
      dVar4 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar4,"Read pixels",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureFilteringTests.cpp"
                      ,0x261);
      local_b35 = false;
      if (this->m_minFilter == 0x2600) {
        local_b35 = this->m_magFilter == 0x2600;
      }
      iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
      pPVar13 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_01,iVar3));
      colorBits.m_data[2] = pPVar13->redBits;
      colorBits.m_data[3] = pPVar13->greenBits;
      glu::TextureTestUtil::getBitsVec
                ((TextureTestUtil *)&local_5f8,(PixelFormat *)(colorBits.m_data + 2));
      tcu::operator-((tcu *)&local_5e8,&local_5f8,2 - (uint)local_b35);
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&lodPrecision.derivateBits,0);
      tcu::max<int,4>((tcu *)local_5d8,&local_5e8,(Vector<int,_4> *)&lodPrecision.derivateBits);
      tcu::LodPrecision::LodPrecision
                ((LodPrecision *)(lookupPrecision.colorThreshold.m_data + 3),RULE_OPENGL);
      tcu::LookupPrecision::LookupPrecision((LookupPrecision *)local_640);
      lookupPrecision.colorMask.m_data[0] = true;
      lookupPrecision.colorMask.m_data[1] = false;
      lookupPrecision.colorMask.m_data[2] = false;
      lookupPrecision.colorMask.m_data[3] = false;
      lodPrecision.rule = 5;
      tcu::computeFixedPointThreshold((tcu *)&local_660,(IVec4 *)local_5d8);
      tcu::operator/(local_650,&local_660,(Vector<float,_4> *)&sampleParams.super_RenderParams.bias)
      ;
      lookupPrecision.uvwBits.m_data._4_8_ = local_650;
      lookupPrecision.colorThreshold.m_data[0] = afStack_648[0];
      lookupPrecision.colorThreshold.m_data[1] = afStack_648[1];
      tcu::Vector<int,_3>::Vector(&local_66c,10,10,10);
      lookupPrecision.coordBits.m_data[0] = local_66c.m_data[2];
      local_640._0_4_ = local_66c.m_data[0];
      local_640._4_4_ = local_66c.m_data[1];
      tcu::Vector<int,_3>::Vector((Vector<int,_3> *)auStack_678,6,6,0);
      lookupPrecision.uvwBits.m_data[0] = local_670;
      lookupPrecision.coordBits.m_data[1] = _auStack_678;
      lookupPrecision.coordBits.m_data[2] = iStack_674;
      glu::TextureTestUtil::getCompareMask
                ((TextureTestUtil *)&local_67c,(PixelFormat *)(colorBits.m_data + 2));
      lookupPrecision.colorThreshold.m_data[2] = local_67c;
      pTVar2 = (this->super_TestCase).super_TestNode.m_testCtx;
      tcu::Surface::getAccess
                ((PixelBufferAccess *)&local_6a8,
                 (Surface *)
                 &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      pTVar10 = glu::TextureCube::getRefTexture(pvVar9->texture);
      tcu::TextureCube::operator_cast_to_TextureCubeView(&local_6e0,pTVar10);
      pvVar12 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_3f8,0);
      local_67d = glu::TextureTestUtil::verifyTextureResult
                            (pTVar2,&local_6a8,&local_6e0,pvVar12,(ReferenceParams *)local_1fc,
                             (LookupPrecision *)local_640,
                             (LodPrecision *)(lookupPrecision.colorThreshold.m_data + 3),
                             (PixelFormat *)(colorBits.m_data + 2));
      if (!(bool)local_67d) {
        lodPrecision.rule = 4;
        tcu::Vector<int,_3>::Vector(&local_6ec,4,4,0);
        lookupPrecision.uvwBits.m_data[0] = local_6ec.m_data[2];
        lookupPrecision.coordBits.m_data[1] = local_6ec.m_data[0];
        lookupPrecision.coordBits.m_data[2] = local_6ec.m_data[1];
        pTVar8 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)local_870,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar11 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_870,
                             (char (*) [98])
                             "Warning: Verification against high precision requirements failed, trying with lower requirements."
                            );
        tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_870);
        pTVar2 = (this->super_TestCase).super_TestNode.m_testCtx;
        tcu::Surface::getAccess
                  ((PixelBufferAccess *)&local_8a0,
                   (Surface *)
                   &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        pTVar10 = glu::TextureCube::getRefTexture(pvVar9->texture);
        tcu::TextureCube::operator_cast_to_TextureCubeView(&local_8d8,pTVar10);
        pvVar12 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)local_3f8,0);
        local_871 = glu::TextureTestUtil::verifyTextureResult
                              (pTVar2,&local_8a0,&local_8d8,pvVar12,(ReferenceParams *)local_1fc,
                               (LookupPrecision *)local_640,
                               (LodPrecision *)(lookupPrecision.colorThreshold.m_data + 3),
                               (PixelFormat *)(colorBits.m_data + 2));
        if ((bool)local_871) {
          qVar6 = tcu::TestContext::getTestResult((this->super_TestCase).super_TestNode.m_testCtx);
          if (qVar6 == QP_TEST_RESULT_PASS) {
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestNode.m_testCtx,
                       QP_TEST_RESULT_QUALITY_WARNING,"Low-quality filtering result");
          }
        }
        else {
          pTVar8 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_a58,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar11 = tcu::MessageBuilder::operator<<
                              (&local_a58,
                               (char (*) [82])
                               "ERROR: Verification against low precision requirements failed, failing test case."
                              );
          tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_a58);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                     "Image verification failed");
        }
      }
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_3f8);
      tcu::Surface::~Surface
                ((Surface *)
                 &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    this->m_caseNdx = this->m_caseNdx + 1;
    iVar3 = this->m_caseNdx;
    sVar14 = std::
             vector<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase>_>
             ::size(&this->m_cases);
    tcu::ScopedLogSection::~ScopedLogSection(&local_38);
    return (uint)(iVar3 < (int)sVar14);
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Too small render target",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureFilteringTests.cpp"
             ,0x23b);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

TextureCubeFilteringCase::IterateResult TextureCubeFilteringCase::iterate (void)
{
	const glw::Functions&			gl				= m_renderCtx.getFunctions();
	const int						viewportSize	= 28;
	const RandomViewport			viewport		(m_renderCtx.getRenderTarget(), viewportSize, viewportSize, deStringHash(getName()) ^ deInt32Hash(m_caseNdx));
	const tcu::ScopedLogSection		iterSection		(m_testCtx.getLog(), string("Test") + de::toString(m_caseNdx), string("Test ") + de::toString(m_caseNdx));
	const FilterCase&				curCase			= m_cases[m_caseNdx];
	const tcu::TextureFormat&		texFmt			= curCase.texture->getRefTexture().getFormat();
	const tcu::TextureFormatInfo	fmtInfo			= tcu::getTextureFormatInfo(texFmt);
	ReferenceParams					sampleParams	(TEXTURETYPE_CUBE);

	if (viewport.width < viewportSize || viewport.height < viewportSize)
		throw tcu::NotSupportedError("Too small render target", DE_NULL, __FILE__, __LINE__);

	// Setup texture
	gl.bindTexture	(GL_TEXTURE_CUBE_MAP, curCase.texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER,	m_magFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T,		m_wrapT);

	// Other state
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	// Params for reference computation.
	sampleParams.sampler					= glu::mapGLSampler(GL_CLAMP_TO_EDGE, GL_CLAMP_TO_EDGE, m_minFilter, m_magFilter);
	sampleParams.sampler.seamlessCubeMap	= true;
	sampleParams.samplerType				= getSamplerType(texFmt);
	sampleParams.colorBias					= fmtInfo.lookupBias;
	sampleParams.colorScale					= fmtInfo.lookupScale;
	sampleParams.lodMode					= LODMODE_EXACT;

	m_testCtx.getLog() << TestLog::Message << "Coordinates: " << curCase.bottomLeft << " -> " << curCase.topRight << TestLog::EndMessage;

	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		const tcu::CubeFace		face		= tcu::CubeFace(faceNdx);
		tcu::Surface			result		(viewport.width, viewport.height);
		vector<float>			texCoord;

		computeQuadTexCoordCube(texCoord, face, curCase.bottomLeft, curCase.topRight);

		m_testCtx.getLog() << TestLog::Message << "Face " << getFaceDesc(face) << TestLog::EndMessage;

		// \todo Log texture coordinates.

		m_renderer.renderQuad(0, &texCoord[0], sampleParams);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");

		glu::readPixels(m_renderCtx, viewport.x, viewport.y, result.getAccess());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels");

		{
			const bool				isNearestOnly	= m_minFilter == GL_NEAREST && m_magFilter == GL_NEAREST;
			const tcu::PixelFormat	pixelFormat		= m_renderCtx.getRenderTarget().getPixelFormat();
			const tcu::IVec4		colorBits		= max(getBitsVec(pixelFormat) - (isNearestOnly ? 1 : 2), tcu::IVec4(0)); // 1 inaccurate bit if nearest only, 2 otherwise
			tcu::LodPrecision		lodPrecision	(tcu::LodPrecision::RULE_OPENGL);
			tcu::LookupPrecision	lookupPrecision;

			lodPrecision.derivateBits		= 10;
			lodPrecision.lodBits			= 5;
			lookupPrecision.colorThreshold	= tcu::computeFixedPointThreshold(colorBits) / sampleParams.colorScale;
			lookupPrecision.coordBits		= tcu::IVec3(10,10,10);
			lookupPrecision.uvwBits			= tcu::IVec3(6,6,0);
			lookupPrecision.colorMask		= getCompareMask(pixelFormat);

			const bool isHighQuality = verifyTextureResult(m_testCtx, result.getAccess(), curCase.texture->getRefTexture(),
														   &texCoord[0], sampleParams, lookupPrecision, lodPrecision, pixelFormat);

			if (!isHighQuality)
			{
				// Evaluate against lower precision requirements.
				lodPrecision.lodBits	= 4;
				lookupPrecision.uvwBits	= tcu::IVec3(4,4,0);

				m_testCtx.getLog() << TestLog::Message << "Warning: Verification against high precision requirements failed, trying with lower requirements." << TestLog::EndMessage;

				const bool isOk = verifyTextureResult(m_testCtx, result.getAccess(), curCase.texture->getRefTexture(),
													  &texCoord[0], sampleParams, lookupPrecision, lodPrecision, pixelFormat);

				if (!isOk)
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
				}
				else if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Low-quality filtering result");
			}
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? CONTINUE : STOP;
}